

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O2

errr next_blockheader(ang_file *f,blockheader *b)

{
  int iVar1;
  errr eVar2;
  uint uVar3;
  uint uVar4;
  uint8_t savefile_head [28];
  
  iVar1 = file_read(f,(char *)savefile_head,0x1c);
  if (iVar1 == 0) {
    eVar2 = 1;
  }
  else {
    eVar2 = -1;
    if ((iVar1 == 0x1c) && (savefile_head[0xf] == '\0')) {
      my_strcpy(b->name,(char *)savefile_head,0x10);
      b->version = savefile_head._16_4_;
      uVar4 = (uint)(ushort)savefile_head._22_2_ << 0x10 | (uint)savefile_head[0x15] << 8 |
              (uint)savefile_head[0x14];
      uVar3 = (uVar4 - (savefile_head[0x14] & 3)) + 4;
      if ((savefile_head[0x14] & 3) == 0) {
        uVar3 = uVar4;
      }
      b->size = uVar3;
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

static errr next_blockheader(ang_file *f, struct blockheader *b) {
	uint8_t savefile_head[SAVEFILE_HEAD_SIZE];
	size_t len;

	len = file_read(f, (char *)savefile_head, SAVEFILE_HEAD_SIZE);
	if (len == 0) /* no more blocks */
		return 1;

	if (len != SAVEFILE_HEAD_SIZE || savefile_head[15] != 0) {
		return -1;
	}

#define RECONSTRUCT_U32B(from) \
	((uint32_t) savefile_head[from]) | \
	((uint32_t) savefile_head[from+1] << 8) | \
	((uint32_t) savefile_head[from+2] << 16) | \
	((uint32_t) savefile_head[from+3] << 24);

	my_strcpy(b->name, (char *)&savefile_head, sizeof b->name);
	b->version = RECONSTRUCT_U32B(16);
	b->size = RECONSTRUCT_U32B(20);

	/* Pad to 4 bytes */
	if (b->size % 4)
		b->size += 4 - (b->size % 4);

	return 0;
}